

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.cpp
# Opt level: O0

void __thiscall
SplitStringTest_random_long_trailing_two_delim_Test<signed_char>::
SplitStringTest_random_long_trailing_two_delim_Test
          (SplitStringTest_random_long_trailing_two_delim_Test<signed_char> *this)

{
  SplitStringTest_random_long_trailing_two_delim_Test<signed_char> *this_local;
  
  SplitStringTest<signed_char>::SplitStringTest(&this->super_SplitStringTest<signed_char>);
  *(undefined ***)&this->super_SplitStringTest<signed_char> =
       &PTR__SplitStringTest_random_long_trailing_two_delim_Test_0081f4a0;
  return;
}

Assistant:

TYPED_TEST(SplitStringTest, random_long_trailing_two_delim) {
	auto delim = make_delim_long<TypeParam>(8);
	RandomTestData<TypeParam> data{ delim };
	data.m_str += delim + delim;
	data.m_tokens.emplace_back();
	data.m_tokens.emplace_back();
	std::vector<std::basic_string<TypeParam>> split_result = split(data.m_str, delim);
	EXPECT_EQ(split_result, data.m_tokens);
}